

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
duckdb_fmt::v6::internal::
arg_formatter_base<duckdb_fmt::v6::buffer_range<wchar_t>,_duckdb_fmt::v6::internal::error_handler>::
char_spec_handler::on_int(char_spec_handler *this)

{
  arg_formatter_base<duckdb_fmt::v6::buffer_range<wchar_t>,_duckdb_fmt::v6::internal::error_handler>
  *this_00;
  
  this_00 = this->formatter;
  if (this_00->specs_ != (basic_format_specs<wchar_t> *)0x0) {
    basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::
    write_int<wchar_t,duckdb_fmt::v6::basic_format_specs<wchar_t>>
              ((basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>> *)this_00,this->value,
               this_00->specs_);
    return;
  }
  basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::write<wchar_t,_0>
            (&this_00->writer_,this->value);
  return;
}

Assistant:

void on_int() {
      if (formatter.specs_)
        formatter.writer_.write_int(value, *formatter.specs_);
      else
        formatter.writer_.write(value);
    }